

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

Error asmjit::v1_14::Formatter::formatRegister
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,RegType regType,
                uint32_t regId)

{
  Error EVar1;
  
  if ((byte)(arch - k32BitMask) < 2) {
    EVar1 = x86::FormatterInternal::formatRegister(sb,formatFlags,emitter,arch,regType,regId);
    return EVar1;
  }
  if ((arch < (kAArch64_BE|kHost)) && ((0x38e0U >> (arch & 0x1f) & 1) != 0)) {
    EVar1 = arm::FormatterInternal::formatRegister
                      (sb,formatFlags,emitter,arch,regType,regId,0,0xffffffff);
    return EVar1;
  }
  return 4;
}

Assistant:

Error formatRegister(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  Arch arch,
  RegType regType,
  uint32_t regId) noexcept {

#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::FormatterInternal::formatRegister(sb, formatFlags, emitter, arch, regType, regId);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyARM(arch))
    return arm::FormatterInternal::formatRegister(sb, formatFlags, emitter, arch, regType, regId);
#endif

  return kErrorInvalidArch;
}